

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_file_sync(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  uv_loop_t *puVar2;
  uv_fs_t *loop;
  char *pcVar3;
  int in_EDI;
  int add_flags;
  uv_fs_t *puVar4;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_dirent_t *unaff_R15;
  uv_buf_t uVar5;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_dirent_t uStackY_b8;
  uv_loop_t *puStackY_a8;
  char *pcStackY_a0;
  uv_fs_t *puStackY_90;
  code *pcStackY_88;
  code *pcStackY_80;
  uv_dirent_t uStackY_78;
  char *pcStackY_68;
  
  fs_file_sync(in_EDI);
  fs_file_sync(in_EDI);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar2 = uv_default_loop();
  ::loop = puVar2;
  iVar1 = uv_fs_open(puVar2,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  add_flags = (int)puVar2;
  if (iVar1 < 0) {
    fs_file_sync_cold_1();
LAB_00159614:
    fs_file_sync_cold_2();
LAB_00159619:
    fs_file_sync_cold_3();
LAB_0015961e:
    fs_file_sync_cold_4();
LAB_00159623:
    fs_file_sync_cold_5();
LAB_00159628:
    fs_file_sync_cold_6();
LAB_0015962d:
    fs_file_sync_cold_7();
LAB_00159632:
    fs_file_sync_cold_8();
LAB_00159637:
    fs_file_sync_cold_9();
LAB_0015963c:
    fs_file_sync_cold_10();
LAB_00159641:
    fs_file_sync_cold_11();
LAB_00159646:
    fs_file_sync_cold_12();
LAB_0015964b:
    fs_file_sync_cold_13();
LAB_00159650:
    fs_file_sync_cold_14();
LAB_00159655:
    fs_file_sync_cold_15();
LAB_0015965a:
    fs_file_sync_cold_16();
LAB_0015965f:
    fs_file_sync_cold_17();
LAB_00159664:
    fs_file_sync_cold_18();
LAB_00159669:
    fs_file_sync_cold_19();
LAB_0015966e:
    fs_file_sync_cold_20();
LAB_00159673:
    fs_file_sync_cold_21();
LAB_00159678:
    fs_file_sync_cold_22();
LAB_0015967d:
    fs_file_sync_cold_23();
LAB_00159682:
    fs_file_sync_cold_24();
LAB_00159687:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00159614;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    add_flags = 0;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159619;
    if (write_req.result < 0) goto LAB_0015961e;
    uv_fs_req_cleanup(&write_req);
    add_flags = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159623;
    if (close_req.result != 0) goto LAB_00159628;
    uv_fs_req_cleanup(&close_req);
    add_flags = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",2,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_0015962d;
    if (open_req1.result._4_4_ < 0) goto LAB_00159632;
    uv_fs_req_cleanup(&open_req1);
    uVar5 = uv_buf_init(buf,0x20);
    add_flags = 0;
    iov = uVar5;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_00159637;
    if (read_req.result < 0) goto LAB_0015963c;
    add_flags = 0x3120e0;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00159641;
    uv_fs_req_cleanup(&read_req);
    add_flags = 0;
    iVar1 = uv_fs_ftruncate((uv_loop_t *)0x0,&ftruncate_req,(uv_file)open_req1.result,7,
                            (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159646;
    if (ftruncate_req.result != 0) goto LAB_0015964b;
    uv_fs_req_cleanup(&ftruncate_req);
    add_flags = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159650;
    if (close_req.result != 0) goto LAB_00159655;
    uv_fs_req_cleanup(&close_req);
    add_flags = 0;
    iVar1 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015965a;
    if (rename_req.result != 0) goto LAB_0015965f;
    uv_fs_req_cleanup(&rename_req);
    add_flags = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159664;
    if (open_req1.result._4_4_ < 0) goto LAB_00159669;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar5 = uv_buf_init(buf,0x20);
    add_flags = 0;
    iov = uVar5;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_0015966e;
    if (read_req.result < 0) goto LAB_00159673;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_00159678;
    uv_fs_req_cleanup(&read_req);
    add_flags = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015967d;
    if (close_req.result != 0) goto LAB_00159682;
    uv_fs_req_cleanup(&close_req);
    add_flags = 0;
    iVar1 = uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159687;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      iVar1 = unlink("test_file2");
      return iVar1;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(add_flags);
  fs_file_write_null_buffer(add_flags);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  ::loop = uv_default_loop();
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_001597e6:
    fs_file_write_null_buffer_cold_2();
LAB_001597eb:
    fs_file_write_null_buffer_cold_3();
LAB_001597f0:
    fs_file_write_null_buffer_cold_4();
LAB_001597f5:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001597e6;
    uv_fs_req_cleanup(&open_req1);
    uVar5 = uv_buf_init((char *)0x0,0);
    iov = uVar5;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001597eb;
    if (write_req.result != 0) goto LAB_001597f0;
    uv_fs_req_cleanup(&write_req);
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_001597f5;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar1 = unlink("test_file");
      return iVar1;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStackY_68 = "test_file";
  pcStackY_80 = (code *)0x159818;
  unlink("test_dir/file1");
  pcStackY_80 = (code *)0x159824;
  unlink("test_dir/file2");
  puVar2 = (uv_loop_t *)0x1a3609;
  pcStackY_80 = (code *)0x159833;
  rmdir("test_dir");
  pcStackY_80 = (code *)0x159838;
  loop = (uv_fs_t *)uv_default_loop();
  pcStackY_80 = (code *)0x15985d;
  ::loop = (uv_loop_t *)loop;
  iVar1 = uv_fs_mkdir((uv_loop_t *)loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStackY_80 = (code *)0x159873;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_00159c80;
    loop = (uv_fs_t *)0x0;
    pcStackY_80 = (code *)0x1598a3;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159c85;
    pcStackY_80 = (code *)0x1598b7;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_80 = (code *)0x1598cd;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159c8a;
    pcStackY_80 = (code *)0x1598e1;
    uv_fs_req_cleanup(&close_req);
    loop = (uv_fs_t *)0x0;
    pcStackY_80 = (code *)0x159904;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159c8f;
    pcStackY_80 = (code *)0x159918;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_80 = (code *)0x15992e;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159c94;
    pcStackY_80 = (code *)0x159942;
    uv_fs_req_cleanup(&close_req);
    pcStackY_80 = (code *)0x159965;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_scandir(::loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_00159c99;
    pcStackY_80 = (code *)0x15997b;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_00159c9e;
    loop = (uv_fs_t *)0x0;
    pcStackY_80 = (code *)0x1599a2;
    iVar1 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    if (iVar1 != 2) goto LAB_00159ca3;
    if (scandir_req.result != 2) goto LAB_00159ca8;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00159cad;
    pcStackY_80 = (code *)0x1599d6;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_78);
    if (iVar1 != -0xfff) {
      puVar2 = (uv_loop_t *)0x1a20e8;
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        loop = (uv_fs_t *)uStackY_78.name;
        pcVar3 = "file1";
        pcStackY_80 = (code *)0x159a04;
        iVar1 = strcmp(uStackY_78.name,"file1");
        if (iVar1 != 0) {
          pcVar3 = "file2";
          pcStackY_80 = (code *)0x159a13;
          iVar1 = strcmp((char *)loop,"file2");
          if (iVar1 != 0) {
            pcStackY_80 = (code *)0x159c7b;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &uStackY_78;
            goto LAB_00159c7b;
          }
        }
        dent.name = (char *)(ulong)uStackY_78.type;
        pcStackY_80 = (code *)0x159a24;
        dent._8_8_ = pcVar3;
        assert_is_file_type(dent);
        pcStackY_80 = (code *)0x159a2f;
        iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_78);
        unaff_R15 = &uStackY_78;
      } while (iVar1 != -0xfff);
    }
    loop = &scandir_req;
    pcStackY_80 = (code *)0x159a42;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) goto LAB_00159cb2;
    pcStackY_80 = (code *)0x159a71;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00159cb7;
    pcStackY_80 = (code *)0x159a87;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_80 = (code *)0x159aa8;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00159cbc;
    pcStackY_80 = (code *)0x159abe;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_80 = (code *)0x159adf;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00159cc1;
    pcStackY_80 = (code *)0x159af5;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_80 = (code *)0x159b16;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00159cc6;
    pcStackY_80 = (code *)0x159b2c;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (stat_cb_count != 4) goto LAB_00159ccb;
    pcStackY_80 = (code *)0x159b5a;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_00159cd0;
    pcStackY_80 = (code *)0x159b70;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 1) goto LAB_00159cd5;
    pcStackY_80 = (code *)0x159b9e;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_00159cda;
    pcStackY_80 = (code *)0x159bb4;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 2) goto LAB_00159cdf;
    pcStackY_80 = (code *)0x159be2;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_rmdir(::loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_00159ce4;
    pcStackY_80 = (code *)0x159bf8;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (rmdir_cb_count != 1) goto LAB_00159ce9;
    pcStackY_80 = (code *)0x159c11;
    unlink("test_dir/file1");
    pcStackY_80 = (code *)0x159c1d;
    unlink("test_dir/file2");
    pcStackY_80 = (code *)0x159c29;
    rmdir("test_dir");
    pcStackY_80 = (code *)0x159c2e;
    puVar2 = uv_default_loop();
    pcStackY_80 = (code *)0x159c42;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStackY_80 = (code *)0x159c4c;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStackY_80 = (code *)0x159c51;
    loop = (uv_fs_t *)uv_default_loop();
    pcStackY_80 = (code *)0x159c59;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      pcStackY_80 = (code *)0x159c66;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_00159c7b:
    pcStackY_80 = (code *)0x159c80;
    run_test_fs_async_dir_cold_1();
LAB_00159c80:
    pcStackY_80 = (code *)0x159c85;
    run_test_fs_async_dir_cold_2();
LAB_00159c85:
    pcStackY_80 = (code *)0x159c8a;
    run_test_fs_async_dir_cold_3();
LAB_00159c8a:
    pcStackY_80 = (code *)0x159c8f;
    run_test_fs_async_dir_cold_4();
LAB_00159c8f:
    pcStackY_80 = (code *)0x159c94;
    run_test_fs_async_dir_cold_5();
LAB_00159c94:
    pcStackY_80 = (code *)0x159c99;
    run_test_fs_async_dir_cold_6();
LAB_00159c99:
    pcStackY_80 = (code *)0x159c9e;
    run_test_fs_async_dir_cold_7();
LAB_00159c9e:
    pcStackY_80 = (code *)0x159ca3;
    run_test_fs_async_dir_cold_8();
LAB_00159ca3:
    pcStackY_80 = (code *)0x159ca8;
    run_test_fs_async_dir_cold_9();
LAB_00159ca8:
    pcStackY_80 = (code *)0x159cad;
    run_test_fs_async_dir_cold_10();
LAB_00159cad:
    pcStackY_80 = (code *)0x159cb2;
    run_test_fs_async_dir_cold_25();
LAB_00159cb2:
    pcStackY_80 = (code *)0x159cb7;
    run_test_fs_async_dir_cold_12();
LAB_00159cb7:
    pcStackY_80 = (code *)0x159cbc;
    run_test_fs_async_dir_cold_13();
LAB_00159cbc:
    pcStackY_80 = (code *)0x159cc1;
    run_test_fs_async_dir_cold_14();
LAB_00159cc1:
    pcStackY_80 = (code *)0x159cc6;
    run_test_fs_async_dir_cold_15();
LAB_00159cc6:
    pcStackY_80 = (code *)0x159ccb;
    run_test_fs_async_dir_cold_16();
LAB_00159ccb:
    pcStackY_80 = (code *)0x159cd0;
    run_test_fs_async_dir_cold_17();
LAB_00159cd0:
    pcStackY_80 = (code *)0x159cd5;
    run_test_fs_async_dir_cold_18();
LAB_00159cd5:
    pcStackY_80 = (code *)0x159cda;
    run_test_fs_async_dir_cold_19();
LAB_00159cda:
    pcStackY_80 = (code *)0x159cdf;
    run_test_fs_async_dir_cold_20();
LAB_00159cdf:
    pcStackY_80 = (code *)0x159ce4;
    run_test_fs_async_dir_cold_21();
LAB_00159ce4:
    pcStackY_80 = (code *)0x159ce9;
    run_test_fs_async_dir_cold_22();
LAB_00159ce9:
    pcStackY_80 = (code *)0x159cee;
    run_test_fs_async_dir_cold_23();
  }
  pcStackY_80 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (loop == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_00159d4d;
    if (mkdir_req.result != 0) goto LAB_00159d52;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00159d57;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return extraout_EAX;
    }
  }
  else {
    pcStackY_88 = (code *)0x159d4d;
    mkdir_cb_cold_1();
LAB_00159d4d:
    pcStackY_88 = (code *)0x159d52;
    mkdir_cb_cold_2();
LAB_00159d52:
    pcStackY_88 = (code *)0x159d57;
    mkdir_cb_cold_3();
LAB_00159d57:
    pcStackY_88 = (code *)0x159d5c;
    mkdir_cb_cold_5();
  }
  pcStackY_88 = scandir_cb;
  mkdir_cb_cold_4();
  puStackY_a8 = puVar2;
  pcStackY_a0 = unaff_R12;
  puStackY_90 = unaff_R14;
  pcStackY_88 = (code *)unaff_R15;
  if (loop == &scandir_req) {
    puVar4 = loop;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00159e68;
    if (scandir_req.result != 2) goto LAB_00159e6d;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00159e72;
    puVar4 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_b8);
    loop = (uv_fs_t *)uStackY_b8.name;
    while (iVar1 != -0xfff) {
      pcVar3 = "file1";
      uStackY_b8.name = (char *)loop;
      iVar1 = strcmp((char *)loop,"file1");
      if (iVar1 != 0) {
        pcVar3 = "file2";
        iVar1 = strcmp((char *)loop,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00159e63;
        }
      }
      dent_00.name = (char *)(ulong)uStackY_b8.type;
      dent_00._8_8_ = pcVar3;
      assert_is_file_type(dent_00);
      puVar4 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_b8);
      loop = (uv_fs_t *)uStackY_b8.name;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00159e77;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_00159e7c;
    puVar4 = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return extraout_EAX_00;
    }
  }
  else {
LAB_00159e63:
    scandir_cb_cold_1();
    puVar4 = loop;
LAB_00159e68:
    scandir_cb_cold_2();
LAB_00159e6d:
    scandir_cb_cold_3();
LAB_00159e72:
    scandir_cb_cold_8();
LAB_00159e77:
    scandir_cb_cold_7();
LAB_00159e7c:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar4 < 2) {
    return extraout_EAX_01;
  }
  assert_is_file_type_cold_1();
  if (puVar4 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00159ee4;
    if (stat_req.result != 0) goto LAB_00159ee9;
    if (stat_req.ptr == (void *)0x0) goto LAB_00159eee;
    stat_cb_count = stat_cb_count + 1;
    puVar4 = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return extraout_EAX_02;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00159ee4:
    stat_cb_cold_2();
LAB_00159ee9:
    stat_cb_cold_3();
LAB_00159eee:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar4 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_00159f30;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return extraout_EAX_03;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_00159f30:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar4 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00159f94;
    if (rmdir_req.result != 0) goto LAB_00159f99;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return extraout_EAX_04;
      }
      goto LAB_00159fa3;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00159f94:
    rmdir_cb_cold_2();
LAB_00159f99:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00159fa3:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return 0;
}

Assistant:

TEST_IMPL(fs_file_sync) {
  fs_file_sync(0);
  fs_file_sync(UV_FS_O_FILEMAP);

  MAKE_VALGRIND_HAPPY();
  return 0;
}